

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

uint64_t __thiscall r_exec::Group::get_next_upr_time(Group *this,uint64_t now)

{
  uint32_t uVar1;
  long lVar2;
  long lVar3;
  uint64_t uVar4;
  
  uVar1 = get_upr(this);
  if (uVar1 == 0) {
    uVar4 = 0xffffffffffffffff;
  }
  else {
    lVar2 = r_code::Utils::GetBasePeriod();
    lVar3 = r_code::Utils::GetTimeReference();
    uVar4 = (lVar2 * (ulong)uVar1 + now) - (now - lVar3) % (lVar2 * (ulong)uVar1);
  }
  return uVar4;
}

Assistant:

uint64_t Group::get_next_upr_time(uint64_t now) const
{
    uint64_t __upr = get_upr();

    if (__upr == 0) {
        return Utils::MaxTime;
    }

    uint64_t _upr = __upr * Utils::GetBasePeriod();
    uint64_t delta = (now - Utils::GetTimeReference()) % _upr;
    return now - delta + _upr;
}